

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall HighsDomain::changeBound(HighsDomain *this,HighsDomainChange boundchg,Reason reason)

{
  pointer *ppHVar1;
  pointer *ppRVar2;
  double *pdVar3;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  bool bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  HighsInt prevPos;
  double oldbound;
  HighsDomainChange local_40;
  int local_2c;
  double local_28;
  Reason local_20;
  
  local_40._8_8_ = boundchg._8_8_;
  local_40.boundval = boundchg.boundval;
  iVar10 = boundchg.column;
  lVar5 = (long)iVar10;
  iVar9 = reason.type;
  if ((ulong)local_40._8_8_ >> 0x20 == 0) {
    dVar11 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    if ((local_40.boundval <= dVar11) && (local_40.boundval = dVar11, iVar9 != -1)) {
      return;
    }
    dVar12 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    lVar7 = 0x290;
    if (local_40.boundval <= dVar12) goto LAB_00290a66;
    pdVar3 = &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    if (local_40.boundval - dVar12 < *pdVar3 || local_40.boundval - dVar12 == *pdVar3) {
LAB_00290a54:
      local_40.boundval = dVar12;
      if ((dVar12 == dVar11) && (!NAN(dVar12) && !NAN(dVar11))) {
        return;
      }
      goto LAB_00290a66;
    }
  }
  else {
    dVar11 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    if ((dVar11 <= local_40.boundval) && (local_40.boundval = dVar11, iVar9 != -1)) {
      return;
    }
    dVar12 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    lVar7 = 0x2a8;
    if (dVar12 <= local_40.boundval) goto LAB_00290a66;
    pdVar3 = &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    if (dVar12 - local_40.boundval < *pdVar3 || dVar12 - local_40.boundval == *pdVar3)
    goto LAB_00290a54;
  }
  if (this->infeasible_ == false) {
    uVar8 = (long)(this->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start;
    this->infeasible_pos = (HighsInt)(uVar8 >> 4);
    this->infeasible_ = true;
    this->infeasible_reason = (Reason)(uVar8 * 0x10000000 | 0xfffffffa);
  }
LAB_00290a66:
  lVar7 = *(long *)((long)&(this->changedcolsflags_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar7);
  local_2c = *(int *)(lVar7 + lVar5 * 4);
  iVar6 = (int)((ulong)((long)(this->domchgstack_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->domchgstack_).
                             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  *(int *)(lVar7 + lVar5 * 4) = iVar6;
  local_20 = reason;
  if (iVar9 == -1) {
    local_28 = (double)CONCAT44(local_28._4_4_,iVar6);
    __position._M_current =
         (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->branchPos_,__position,(int *)&local_28);
    }
    else {
      *__position._M_current = iVar6;
      (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  if ((((this->mipsolver->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[iVar10] == kContinuous) ||
      (dVar11 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar10], dVar11 != 0.0)) || (NAN(dVar11))) {
    bVar4 = false;
  }
  else {
    bVar4 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar10] == 1.0;
  }
  local_28 = doChangeBound(this,&local_40);
  std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
  emplace_back<double&,int&>
            ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
             &this->prevboundval_,&local_28,&local_2c);
  __position_00._M_current =
       (this->domchgstack_).
       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>::
    _M_realloc_insert<HighsDomainChange_const&>
              ((vector<HighsDomainChange,std::allocator<HighsDomainChange>> *)&this->domchgstack_,
               __position_00,&local_40);
  }
  else {
    (__position_00._M_current)->boundval = local_40.boundval;
    (__position_00._M_current)->column = local_40.column;
    (__position_00._M_current)->boundtype = local_40.boundtype;
    ppHVar1 = &(this->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppHVar1 = *ppHVar1 + 1;
  }
  __position_01._M_current =
       (this->domchgreason_).
       super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<HighsDomain::Reason,std::allocator<HighsDomain::Reason>>::
    _M_realloc_insert<HighsDomain::Reason_const&>
              ((vector<HighsDomain::Reason,std::allocator<HighsDomain::Reason>> *)
               &this->domchgreason_,__position_01,&local_20);
  }
  else {
    *__position_01._M_current = reason;
    ppRVar2 = &(this->domchgreason_).
               super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppRVar2 = *ppRVar2 + 1;
  }
  if ((bVar4) && (this->infeasible_ == false)) {
    dVar11 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_40.column];
    pdVar3 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_40.column;
    if ((dVar11 == *pdVar3) && (!NAN(dVar11) && !NAN(*pdVar3))) {
      HighsCliqueTable::addImplications
                (&((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cliquetable,
                 this,local_40.column,(uint)(0.5 < dVar11));
    }
  }
  return;
}

Assistant:

void HighsDomain::changeBound(HighsDomainChange boundchg, Reason reason) {
  assert(boundchg.column >= 0);
  assert(boundchg.column < (HighsInt)col_upper_.size());
  // assert(infeasible_ == 0);
  // if (reason.type == Reason::kObjective) {
  //   if (!mipsolver->submip)
  //     printf("objective propagator changed %s bound of column %d to %g\n",
  //            boundchg.boundtype == HighsBoundType::kLower ? "lower" :
  //            "upper", boundchg.column, boundchg.boundval);
  // }

  HighsInt prevPos;
  if (boundchg.boundtype == HighsBoundType::kLower) {
    if (boundchg.boundval <= col_lower_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_lower_[boundchg.column];
    }
    if (boundchg.boundval > col_upper_[boundchg.column]) {
      if (boundchg.boundval - col_upper_[boundchg.column] >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_upper_[boundchg.column];
        if (boundchg.boundval == col_lower_[boundchg.column]) return;
      }
    }

    prevPos = colLowerPos_[boundchg.column];
    colLowerPos_[boundchg.column] = domchgstack_.size();
  } else {
    if (boundchg.boundval >= col_upper_[boundchg.column]) {
      if (reason.type != Reason::kBranching) return;
      boundchg.boundval = col_upper_[boundchg.column];
    }
    if (boundchg.boundval < col_lower_[boundchg.column]) {
      if (col_lower_[boundchg.column] - boundchg.boundval >
          mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        if (!infeasible_) {
          infeasible_pos = domchgstack_.size();
          infeasible_ = true;
          infeasible_reason = Reason::conflictingBounds(domchgstack_.size());
        }
      } else {
        boundchg.boundval = col_lower_[boundchg.column];
        if (boundchg.boundval == col_upper_[boundchg.column]) return;
      }
    }

    prevPos = colUpperPos_[boundchg.column];
    colUpperPos_[boundchg.column] = domchgstack_.size();
  }

  mipsolver->mipdata_->debugSolution.boundChangeAdded(
      *this, boundchg, reason.type == Reason::kBranching);

  if (reason.type == Reason::kBranching)
    branchPos_.push_back(domchgstack_.size());

  assert(prevPos < (HighsInt)domchgstack_.size());

  bool binary = isBinary(boundchg.column);

  double oldbound = doChangeBound(boundchg);

  prevboundval_.emplace_back(oldbound, prevPos);
  domchgstack_.push_back(boundchg);
  domchgreason_.push_back(reason);

  if (binary && !infeasible_ && isFixed(boundchg.column))
    mipsolver->mipdata_->cliquetable.addImplications(
        *this, boundchg.column, col_lower_[boundchg.column] > 0.5);
}